

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void P_PlayerInSpecialSector(player_t *player,sector_t *sector)

{
  APlayerPawn *pAVar1;
  AInventory *pAVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  AInventory *pAVar6;
  undefined4 extraout_var;
  PClass *pPVar8;
  PClass *pPVar9;
  bool bVar10;
  FName local_54;
  DAngle local_50;
  DVector3 local_48;
  PClass *pPVar7;
  
  if (sector == (sector_t *)0x0) {
    pAVar1 = player->mo;
    sector = (pAVar1->super_AActor).Sector;
    local_48.X = (pAVar1->super_AActor).__Pos.X;
    local_48.Y = (pAVar1->super_AActor).__Pos.Y;
    dVar3 = sector_t::LowestFloorAt(sector,(DVector2 *)&local_48,(sector_t_conflict **)0x0);
    if ((1.52587890625e-05 <= ABS((pAVar1->super_AActor).__Pos.Z - dVar3)) &&
       ((player->mo->super_AActor).waterlevel == 0)) {
      return;
    }
  }
  iVar4 = sector->damageamount;
  if (iVar4 < 1) {
    if ((iVar4 < 0) && (level.time % (int)sector->damageinterval == 0)) {
      P_GiveBody(&player->mo->super_AActor,-iVar4,100);
    }
  }
  else {
    pAVar2 = (player->mo->super_AActor).Inventory.field_0.p;
    bVar10 = true;
    if (pAVar2 != (AInventory *)0x0) {
      pPVar8 = APowerIronFeet::RegistrationInfo.MyClass;
      if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        do {
          pAVar6 = pAVar2;
          pPVar7 = (pAVar6->super_AActor).super_DThinker.super_DObject.Class;
          pPVar9 = pPVar8;
          if (pPVar7 == (PClass *)0x0) {
            iVar4 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
            pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
            (pAVar6->super_AActor).super_DThinker.super_DObject.Class = pPVar7;
            pPVar9 = APowerIronFeet::RegistrationInfo.MyClass;
          }
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar8 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar8) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if ((bVar10) ||
             (pAVar2 = (pAVar6->super_AActor).Inventory.field_0.p, pAVar2 == (AInventory *)0x0))
          goto LAB_00452c07;
          pPVar8 = pPVar9;
        } while (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
        (pAVar6->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
LAB_00452c07:
        bVar10 = (bool)(bVar10 ^ 1);
      }
      else {
        (player->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      }
    }
    uVar5 = sector->Flags;
    if ((uVar5 >> 8 & 1) != 0) {
      *(byte *)&player->cheats = (byte)player->cheats & 0xfd;
    }
    if (!bVar10) {
      uVar5 = FRandom::GenRand32(&pr_playerinspecialsector);
      if ((int)sector->leakydamage <= (int)(uVar5 & 0xff)) goto LAB_00452d90;
      uVar5 = sector->Flags;
    }
    if ((uVar5 >> 10 & 1) == 0) {
      if (level.time % (int)sector->damageinterval == 0) {
        if ((player->cheats & 0x2000002U) == 0) {
          local_54.Index = (sector->damagetype).super_FName.Index;
          local_50.Degrees = 0.0;
          P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,sector->damageamount,
                       &local_54,0,&local_50);
          uVar5 = sector->Flags;
        }
        if ((((uVar5 >> 9 & 1) != 0) && (player->health < 0xb)) &&
           ((deathmatch.Value == 0 || ((dmflags.Value._1_1_ & 4) == 0)))) {
          G_ExitLevel(0,false);
          uVar5 = sector->Flags;
        }
        if ((char)uVar5 < '\0') {
          pAVar1 = player->mo;
          local_48.X = (pAVar1->super_AActor).__Pos.X;
          local_48.Y = (pAVar1->super_AActor).__Pos.Y;
          local_48.Z = (pAVar1->super_AActor).__Pos.Z;
          P_HitWater(&pAVar1->super_AActor,(pAVar1->super_AActor).Sector,&local_48,false,true,true);
        }
      }
    }
    else {
      player->hazardcount = player->hazardcount + sector->damageamount;
      (player->hazardtype).Index = (sector->damagetype).super_FName.Index;
      player->hazardinterval = (int)sector->damageinterval;
    }
  }
LAB_00452d90:
  if ((int)sector->Flags < 0) {
    sector->Flags = sector->Flags & 0x7fffffff;
    P_GiveSecret(&player->mo->super_AActor,true,true,
                 (int)((ulong)((long)sector - (long)sectors) >> 3) * 0x7a44c6b);
  }
  return;
}

Assistant:

void P_PlayerInSpecialSector (player_t *player, sector_t * sector)
{
	if (sector == NULL)
	{
		// Falling, not all the way down yet?
		sector = player->mo->Sector;
		if (!player->mo->isAtZ(sector->LowestFloorAt(player->mo))
			&& !player->mo->waterlevel)
		{
			return;
		}
	}

	// Has hit ground.
	AInventory *ironfeet;

	// [RH] Apply any customizable damage
	if (sector->damageamount > 0)
	{
		// Allow subclasses. Better would be to implement it as armor and let that reduce
		// the damage as part of the normal damage procedure. Unfortunately, I don't have
		// different damage types yet, so that's not happening for now.
		for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
		{
			if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
				break;
		}

		if (sector->Flags & SECF_ENDGODMODE) player->cheats &= ~CF_GODMODE;
		if ((ironfeet == NULL || pr_playerinspecialsector() < sector->leakydamage))
		{
			if (sector->Flags & SECF_HAZARD)
			{
				player->hazardcount += sector->damageamount;
				player->hazardtype = sector->damagetype;
				player->hazardinterval = sector->damageinterval;
			}
			else if (level.time % sector->damageinterval == 0)
			{
				if (!(player->cheats & (CF_GODMODE|CF_GODMODE2))) P_DamageMobj(player->mo, NULL, NULL, sector->damageamount, sector->damagetype);
				if ((sector->Flags & SECF_ENDLEVEL) && player->health <= 10 && (!deathmatch || !(dmflags & DF_NO_EXIT)))
				{
					G_ExitLevel(0, false);
				}
				if (sector->Flags & SECF_DMGTERRAINFX)
				{
					P_HitWater(player->mo, player->mo->Sector, player->mo->Pos(), false, true, true);
				}
			}
		}
	}
	else if (sector->damageamount < 0)
	{
		if (level.time % sector->damageinterval == 0)
		{
			P_GiveBody(player->mo, -sector->damageamount, 100);
		}
	}

	if (sector->isSecret())
	{
		sector->ClearSecret();
		P_GiveSecret(player->mo, true, true, int(sector - sectors));
	}
}